

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (0 < (long)end - (long)ptr) {
    if (*ptr != '-') {
      *nextTokPtr = ptr;
      return 0;
    }
    pcVar3 = end;
    pcVar2 = ptr + 1;
    while (end_local = pcVar2, 0 < (long)end - (long)end_local) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
      case 0:
      case 1:
      case 8:
        *nextTokPtr = end_local;
        return 0;
      default:
        pcVar2 = end_local + 1;
        break;
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        iVar1 = (*enc[3].literalScanners[1])(enc,end_local,pcVar3,(char **)end_local);
        if (iVar1 != 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        pcVar3 = extraout_RDX;
        pcVar2 = end_local + 2;
        break;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        iVar1 = (*enc[3].sameName)(enc,end_local,pcVar3);
        if (iVar1 != 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        pcVar3 = extraout_RDX_00;
        pcVar2 = end_local + 3;
        break;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        iVar1 = (*enc[3].nameMatchesAscii)(enc,end_local,pcVar3,end_local);
        if (iVar1 != 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        pcVar3 = extraout_RDX_01;
        pcVar2 = end_local + 4;
        break;
      case 0x1b:
        pcVar2 = end_local + 1;
        if ((long)end - (long)pcVar2 < 1) {
          return -1;
        }
        if (*pcVar2 == '-') {
          pcVar3 = end_local + 2;
          if ((long)end - (long)pcVar3 < 1) {
            return -1;
          }
          if (*pcVar3 == '>') {
            *nextTokPtr = end_local + 3;
            return 0xd;
          }
          *nextTokPtr = pcVar3;
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

static int PTRCALL
PREFIX(scanComment)(const ENCODING *enc, const char *ptr,
                    const char *end, const char **nextTokPtr)
{
  if (HAS_CHAR(enc, ptr, end)) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (HAS_CHAR(enc, ptr, end)) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}